

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::
CopyMessageTest_ArenaEnabledCopyConstructorNull_Test::
~CopyMessageTest_ArenaEnabledCopyConstructorNull_Test
          (CopyMessageTest_ArenaEnabledCopyConstructorNull_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CopyMessageTest, ArenaEnabledCopyConstructorNull) {
  proto2_unittest::TestAllTypes message1;
  TestUtil::SetAllFields(&message1);
  proto2_unittest::TestAllTypes* message2 =
      Arena::Create<proto2_unittest::TestAllTypes>(nullptr, message1);
  TestUtil::ExpectAllFieldsSet(*message2);
  delete message2;
}